

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  uint uVar2;
  float *pfVar3;
  uchar *__ptr;
  long lVar4;
  int *piVar5;
  long lVar6;
  float *pfVar7;
  uint uVar8;
  ulong uVar9;
  stbi__result_info *in_R9;
  uint uVar10;
  ulong uVar11;
  uchar *puVar12;
  double dVar13;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar5 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar3 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar5,iVar1);
      if (pfVar3 != (float *)0x0) {
        uVar8 = b * a;
        if (0 < (int)uVar8) {
          uVar10 = (req_comp + (req_comp & 1U)) - 1;
          lVar6 = (long)req_comp;
          uVar9 = 0;
          pfVar7 = pfVar3;
          puVar12 = __ptr;
          do {
            uVar2 = 0;
            if (0 < (int)uVar10) {
              uVar11 = 0;
              do {
                dVar13 = pow((double)((float)puVar12[uVar11] / 255.0),(double)stbi__l2h_gamma);
                pfVar7[uVar11] = (float)((double)stbi__l2h_scale * dVar13);
                uVar11 = uVar11 + 1;
                uVar2 = uVar10;
              } while (uVar10 != uVar11);
            }
            if ((int)uVar2 < req_comp) {
              lVar4 = (ulong)uVar2 + uVar9 * lVar6;
              pfVar3[lVar4] = (float)__ptr[lVar4] / 255.0;
            }
            uVar9 = uVar9 + 1;
            pfVar7 = pfVar7 + lVar6;
            puVar12 = puVar12 + lVar6;
          } while (uVar9 != uVar8);
        }
        free(__ptr);
        return pfVar3;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
  }
  else {
    pfVar3 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar3 != (float *)0x0) {
      if (stbi__vertically_flip_on_load == 0) {
        return pfVar3;
      }
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(pfVar3,*x,*y,req_comp << 2);
      return pfVar3;
    }
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}